

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

raw_ostream * llvm::outs(void)

{
  int iVar1;
  StringRef Filename;
  undefined1 local_20 [8];
  error_code EC;
  
  local_20._0_4_ = 0;
  EC._0_8_ = std::_V2::system_category();
  if (outs()::S == '\0') {
    iVar1 = __cxa_guard_acquire(&outs()::S);
    if (iVar1 != 0) {
      Filename.Length = 1;
      Filename.Data = "-";
      raw_fd_ostream::raw_fd_ostream(&outs::S,Filename,(error_code *)local_20,F_None);
      __cxa_atexit(raw_fd_ostream::~raw_fd_ostream,&outs::S,&__dso_handle);
      __cxa_guard_release(&outs()::S);
    }
  }
  if (local_20._0_4_ == 0) {
    return (raw_ostream *)&outs::S;
  }
  __assert_fail("!EC",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                ,0x281,"raw_ostream &llvm::outs()");
}

Assistant:

raw_ostream &llvm::outs() {
  // Set buffer settings to model stdout behavior.
  std::error_code EC;
  static raw_fd_ostream S("-", EC, sys::fs::OF_None);
  assert(!EC);
  return S;
}